

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessXFBTests.cpp
# Opt level: O2

bool __thiscall
gl4cts::DirectStateAccess::TransformFeedback::ErrorsTest::
testGetTransformFeedbacki64_vQueryForInvalidParameterName(ErrorsTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  deUint32 dVar3;
  int iVar4;
  undefined4 extraout_var;
  bool bVar6;
  GLuint xfb;
  long local_1d0;
  Enum<int,_2UL> local_1c8;
  GLint64 buffer;
  undefined1 local_1b0 [384];
  long lVar5;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar2);
  xfb = 0;
  (**(code **)(lVar5 + 0x408))(1,&xfb);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glCreateTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x56c);
  buffer = 0x4cb2f;
  (*this->m_gl_getTransformFeedbacki64_v)(xfb,0,0,&buffer);
  local_1d0 = lVar5;
  iVar2 = (**(code **)(lVar5 + 0x800))();
  if (iVar2 != 0x500) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetTransformFeedbacki64_v called with invalid parameter name had been expected to generate GL_INVALID_ENUM. However, "
                   );
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = iVar2;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1," was captured.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  bVar6 = buffer != 0x4cb2f;
  if (bVar6) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "glGetTransformFeedbacki64_v called with invalid parameter name had been expected not to change the given buffer."
                   );
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  poVar1 = (ostringstream *)(local_1b0 + 8);
  while( true ) {
    iVar4 = (**(code **)(local_1d0 + 0x800))();
    lVar5 = local_1d0;
    if (iVar4 == 0) break;
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,
                    "Warning! glGetTransformFeedbacki64_v called with invalid parameter name has generated more than one error, The next error was  "
                   );
    local_1c8.m_getName = glu::getErrorName;
    local_1c8.m_value = iVar4;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c8,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,".");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
  }
  (**(code **)(local_1d0 + 0x488))(1,&xfb);
  dVar3 = (**(code **)(lVar5 + 0x800))();
  glu::checkError(dVar3,"glDeleteTransformFeedbacks have failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessXFBTests.cpp"
                  ,0x59b);
  return !bVar6 && iVar2 == 0x500;
}

Assistant:

bool ErrorsTest::testGetTransformFeedbacki64_vQueryForInvalidParameterName()
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Creating XFB object. */
	glw::GLuint xfb = 0;

	gl.createTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateTransformFeedbacks have failed");

	/* Generating invalid parameter name. */
	glw::GLuint invalid_parameter_name = 0;

	/* Dummy storage. */
	glw::GLint64 buffer = 314159;

	/* Error variable. */
	glw::GLenum error = 0;

	/* Default result. */
	bool is_ok = true;

	/* Test of GetTransformFeedbackiv. */
	m_gl_getTransformFeedbacki64_v(xfb, invalid_parameter_name, 0, &buffer);

	if (GL_INVALID_ENUM != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid parameter name had "
											   "been expected to generate GL_INVALID_ENUM. However, "
											<< glu::getErrorStr(error) << " was captured." << tcu::TestLog::EndMessage;

		is_ok = false;
	}

	if (314159 != buffer)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glGetTransformFeedbacki64_v called with invalid parameter name had "
											   "been expected not to change the given buffer."
											<< tcu::TestLog::EndMessage;

		is_ok = false;
	}

	while (GL_NO_ERROR != (error = gl.getError()))
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "Warning! glGetTransformFeedbacki64_v called with invalid parameter "
											   "name has generated more than one error, The next error was  "
											<< glu::getErrorStr(error) << "." << tcu::TestLog::EndMessage;
	}

	/* Clean-up. */
	gl.deleteTransformFeedbacks(1, &xfb);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteTransformFeedbacks have failed");

	return is_ok;
}